

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void testing::internal::PointerPrinter::PrintValue<qclab::qgates::SWAP<std::complex<double>>>
               (SWAP<std::complex<double>_> *p,ostream *os)

{
  ostream *os_local;
  SWAP<std::complex<double>_> *p_local;
  
  if (p == (SWAP<std::complex<double>_> *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::ostream::operator<<(os,p);
  }
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }